

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

uint64_t __thiscall
spvtools::opt::ScalarReplacementPass::GetNumElements(ScalarReplacementPass *this,Instruction *type)

{
  Op OVar1;
  Operand *pOVar2;
  size_t sVar3;
  uint *puVar4;
  bool bVar5;
  size_t local_30;
  size_t i;
  uint64_t len;
  Operand *op;
  Instruction *type_local;
  ScalarReplacementPass *this_local;
  
  OVar1 = opt::Instruction::opcode(type);
  bVar5 = true;
  if (OVar1 != OpTypeVector) {
    OVar1 = opt::Instruction::opcode(type);
    bVar5 = OVar1 == OpTypeMatrix;
  }
  if (!bVar5) {
    __assert_fail("type->opcode() == spv::Op::OpTypeVector || type->opcode() == spv::Op::OpTypeMatrix"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                  ,0x243,
                  "uint64_t spvtools::opt::ScalarReplacementPass::GetNumElements(const Instruction *) const"
                 );
  }
  pOVar2 = opt::Instruction::GetInOperand(type,1);
  sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&pOVar2->words);
  if (sVar3 < 3) {
    i = 0;
    local_30 = 0;
    while( true ) {
      sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&pOVar2->words);
      if (local_30 == sVar3) break;
      puVar4 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar2->words,local_30);
      i = (ulong)*puVar4 << ((byte)(local_30 << 5) & 0x3f) | i;
      local_30 = local_30 + 1;
    }
    return i;
  }
  __assert_fail("op.words.size() <= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x245,
                "uint64_t spvtools::opt::ScalarReplacementPass::GetNumElements(const Instruction *) const"
               );
}

Assistant:

uint64_t ScalarReplacementPass::GetNumElements(const Instruction* type) const {
  assert(type->opcode() == spv::Op::OpTypeVector ||
         type->opcode() == spv::Op::OpTypeMatrix);
  const Operand& op = type->GetInOperand(1u);
  assert(op.words.size() <= 2);
  uint64_t len = 0;
  for (size_t i = 0; i != op.words.size(); ++i) {
    len |= (static_cast<uint64_t>(op.words[i]) << (32ull * i));
  }
  return len;
}